

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

FILE * cimg_library::cimg::fopen(char *__filename,char *__modes)

{
  CImgArgumentException *pCVar1;
  CImgIOException *this;
  FILE *local_48;
  FILE *local_30;
  FILE *res;
  char *mode_local;
  char *path_local;
  
  if (__filename == (char *)0x0) {
    pCVar1 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (pCVar1,"cimg::fopen(): Specified file path is (null).");
    __cxa_throw(pCVar1,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  if (__modes == (char *)0x0) {
    pCVar1 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (pCVar1,"cimg::fopen(): File \'%s\', specified mode is (null).",__filename);
    __cxa_throw(pCVar1,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  if ((*__filename == '-') && ((__filename[1] == '\0' || (__filename[1] == '.')))) {
    if (*__modes == 'r') {
      local_48 = (FILE *)_stdin(true);
    }
    else {
      local_48 = (FILE *)_stdout(true);
    }
    local_30 = local_48;
  }
  else {
    local_30 = (FILE *)std_fopen(__filename,__modes);
  }
  if (local_30 == (FILE *)0x0) {
    this = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (this,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",__filename,__modes
              );
    __cxa_throw(this,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  return local_30;
}

Assistant:

inline std::FILE *fopen(const char *const path, const char *const mode) {
      if (!path)
        throw CImgArgumentException("cimg::fopen(): Specified file path is (null).");
      if (!mode)
        throw CImgArgumentException("cimg::fopen(): File '%s', specified mode is (null).",
                                    path);
      std::FILE *res = 0;
      if (*path=='-' && (!path[1] || path[1]=='.')) {
        res = (*mode=='r')?cimg::_stdin():cimg::_stdout();
#if cimg_OS==2
        if (*mode && mode[1]=='b') { // Force stdin/stdout to be in binary mode
#ifdef __BORLANDC__
          if (setmode(_fileno(res),0x8000)==-1) res = 0;
#else
          if (_setmode(_fileno(res),0x8000)==-1) res = 0;
#endif
        }
#endif
      } else res = cimg::std_fopen(path,mode);
      if (!res) throw CImgIOException("cimg::fopen(): Failed to open file '%s' with mode '%s'.",
                                      path,mode);
      return res;
    }